

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprVariableDefinitions *
AnalyzeVariableDefinitions(ExpressionContext *ctx,SynVariableDefinitions *syntax)

{
  uint uniqueId;
  TypeBase *pTVar1;
  Allocator *allocator;
  ScopeData *scope;
  uint alignment;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  TypeRef *type;
  undefined4 extraout_var_00;
  TypeBase *type_00;
  ExprBase *node;
  ExprVariableDefinitions *pEVar4;
  SynVariableDefinition *syntax_00;
  InplaceStr name;
  IntrusiveList<ExprBase> definitions;
  undefined4 extraout_var_01;
  
  if (syntax->align == (SynAlign *)0x0) {
    alignment = 0;
  }
  else {
    alignment = AnalyzeAlignment(ctx,syntax->align);
  }
  pTVar1 = ctx->scope->ownerType;
  if (pTVar1 != (TypeBase *)0x0) {
    ExpressionContext::PushTemporaryScope(ctx);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
    allocator = ctx->allocator;
    scope = ctx->scope;
    type = ExpressionContext::GetReferenceType(ctx,pTVar1);
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    name.end = "";
    name.begin = "this";
    SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_00,iVar3),name);
    uniqueId = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uniqueId + 1;
    VariableData::VariableData
              ((VariableData *)CONCAT44(extraout_var,iVar2),allocator,&syntax->super_SynBase,scope,0
               ,&type->super_TypeBase,(SynIdentifier *)CONCAT44(extraout_var_00,iVar3),0,uniqueId);
    ExpressionContext::AddVariable(ctx,(VariableData *)CONCAT44(extraout_var,iVar2),true);
  }
  type_00 = AnalyzeType(ctx,syntax->type,true,(bool *)0x0);
  if (pTVar1 != (TypeBase *)0x0) {
    ExpressionContext::PopScope(ctx,SCOPE_TEMPORARY);
  }
  definitions.head = (ExprBase *)0x0;
  definitions.tail = (ExprBase *)0x0;
  syntax_00 = (syntax->definitions).head;
  while (syntax_00 != (SynVariableDefinition *)0x0) {
    node = AnalyzeVariableDefinition(ctx,syntax_00,alignment,type_00);
    IntrusiveList<ExprBase>::push_back(&definitions,node);
    syntax_00 = (SynVariableDefinition *)(syntax_00->super_SynBase).next;
    if ((syntax_00 == (SynVariableDefinition *)0x0) || ((syntax_00->super_SynBase).typeID != 0x33))
    {
      syntax_00 = (SynVariableDefinition *)0x0;
    }
  }
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar4 = (ExprVariableDefinitions *)CONCAT44(extraout_var_01,iVar2);
  pTVar1 = ctx->typeVoid;
  (pEVar4->super_ExprBase).typeID = 0x21;
  (pEVar4->super_ExprBase).source = &syntax->super_SynBase;
  (pEVar4->super_ExprBase).type = pTVar1;
  (pEVar4->super_ExprBase).next = (ExprBase *)0x0;
  (pEVar4->super_ExprBase).listed = false;
  (pEVar4->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00241030;
  pEVar4->definitionType = type_00;
  (pEVar4->definitions).head = definitions.head;
  (pEVar4->definitions).tail = definitions.tail;
  return pEVar4;
}

Assistant:

ExprVariableDefinitions* AnalyzeVariableDefinitions(ExpressionContext &ctx, SynVariableDefinitions *syntax)
{
	unsigned alignment = syntax->align ? AnalyzeAlignment(ctx, syntax->align) : 0;

	TypeBase *parentType = ctx.scope->ownerType;

	if(parentType)
	{
		// Introduce 'this' variable into a temporary scope
		ctx.PushTemporaryScope();

		ctx.AddVariable(new (ctx.get<VariableData>()) VariableData(ctx.allocator, syntax, ctx.scope, 0, ctx.GetReferenceType(parentType), new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("this")), 0, ctx.uniqueVariableId++), true);
	}

	TypeBase *type = AnalyzeType(ctx, syntax->type);

	if(parentType)
		ctx.PopScope(SCOPE_TEMPORARY);

	IntrusiveList<ExprBase> definitions;

	for(SynVariableDefinition *el = syntax->definitions.head; el; el = getType<SynVariableDefinition>(el->next))
		definitions.push_back(AnalyzeVariableDefinition(ctx, el, alignment, type));

	return new (ctx.get<ExprVariableDefinitions>()) ExprVariableDefinitions(syntax, ctx.typeVoid, type, definitions);
}